

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O3

ppointer p_hash_table_lookup(PHashTable *table,pconstpointer key)

{
  ppointer pvVar1;
  PHashTableNode *pPVar2;
  
  if (table == (PHashTable *)0x0) {
    pvVar1 = (ppointer)0x0;
  }
  else {
    pPVar2 = (PHashTableNode *)
             (table->table + ((ulong)(long)((int)key + 0x25) % table->size & 0xffffffff));
    pvVar1 = (ppointer)0xffffffffffffffff;
    while (pPVar2 = pPVar2->next, pPVar2 != (PHashTableNode *)0x0) {
      if (pPVar2->key == key) {
        return pPVar2->value;
      }
    }
  }
  return pvVar1;
}

Assistant:

P_LIB_API ppointer
p_hash_table_lookup (const PHashTable *table, pconstpointer key)
{
	PHashTableNode	*node;
	puint		hash;

	if (P_UNLIKELY (table == NULL))
		return NULL;

	hash = pp_hash_table_calc_hash (key, table->size);

	return ((node = pp_hash_table_find_node (table, key, hash)) == NULL) ? (ppointer) (-1) : node->value;
}